

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmLinkItem * __thiscall
cmGeneratorTarget::ResolveLinkItem
          (cmLinkItem *__return_storage_ptr__,cmGeneratorTarget *this,string *name,
          cmListFileBacktrace *bt)

{
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  cmListFileBacktrace local_d8;
  cmListFileBacktrace local_c8;
  string local_b8;
  undefined4 local_94;
  cmListFileBacktrace local_90 [2];
  string local_70;
  undefined1 local_50 [8];
  TargetOrString resolved;
  cmListFileBacktrace *bt_local;
  string *name_local;
  cmGeneratorTarget *this_local;
  
  resolved.Target = (cmGeneratorTarget *)bt;
  ResolveTargetReference((TargetOrString *)local_50,this,name);
  if (resolved.String.field_2._8_8_ == 0) {
    std::__cxx11::string::string((string *)&local_70,(string *)local_50);
    cmListFileBacktrace::cmListFileBacktrace(local_90,(cmListFileBacktrace *)resolved.Target);
    cmLinkItem::cmLinkItem(__return_storage_ptr__,&local_70,local_90);
    cmListFileBacktrace::~cmListFileBacktrace(local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    TVar2 = GetType((cmGeneratorTarget *)resolved.String.field_2._8_8_);
    if (TVar2 == EXECUTABLE) {
      bVar1 = IsExecutableWithExports((cmGeneratorTarget *)resolved.String.field_2._8_8_);
      if (!bVar1) {
        psVar3 = GetName_abi_cxx11_((cmGeneratorTarget *)resolved.String.field_2._8_8_);
        std::__cxx11::string::string((string *)&local_b8,(string *)psVar3);
        cmListFileBacktrace::cmListFileBacktrace(&local_c8,(cmListFileBacktrace *)resolved.Target);
        cmLinkItem::cmLinkItem(__return_storage_ptr__,&local_b8,&local_c8);
        cmListFileBacktrace::~cmListFileBacktrace(&local_c8);
        std::__cxx11::string::~string((string *)&local_b8);
        goto LAB_004a599d;
      }
    }
    cmListFileBacktrace::cmListFileBacktrace(&local_d8,(cmListFileBacktrace *)resolved.Target);
    cmLinkItem::cmLinkItem
              (__return_storage_ptr__,(cmGeneratorTarget *)resolved.String.field_2._8_8_,&local_d8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_d8);
  }
LAB_004a599d:
  local_94 = 1;
  TargetOrString::~TargetOrString((TargetOrString *)local_50);
  return __return_storage_ptr__;
}

Assistant:

cmLinkItem cmGeneratorTarget::ResolveLinkItem(
  std::string const& name, cmListFileBacktrace const& bt) const
{
  TargetOrString resolved = this->ResolveTargetReference(name);

  if (!resolved.Target) {
    return cmLinkItem(resolved.String, bt);
  }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (resolved.Target->GetType() == cmStateEnums::EXECUTABLE &&
      !resolved.Target->IsExecutableWithExports()) {
    return cmLinkItem(resolved.Target->GetName(), bt);
  }

  return cmLinkItem(resolved.Target, bt);
}